

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O1

void __thiscall btCompoundShape::removeChildShapeByIndex(btCompoundShape *this,int childShapeIndex)

{
  int *piVar1;
  btCompoundShapeChild *pbVar2;
  btDbvtNode *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  btCollisionShape *pbVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  
  this->m_updateRevision = this->m_updateRevision + 1;
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    btDbvt::remove(this->m_dynamicAabbTree,(char *)(this->m_children).m_data[childShapeIndex].m_node
                  );
  }
  lVar15 = (long)(this->m_children).m_size;
  pbVar2 = (this->m_children).m_data;
  uVar4 = *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_basis.m_el[0].m_floats;
  uVar5 = *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_basis.m_el[0].m_floats + 2);
  uVar6 = *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_basis.m_el[1].m_floats;
  uVar7 = *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_basis.m_el[1].m_floats + 2);
  uVar8 = *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_basis.m_el[2].m_floats;
  uVar9 = *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_basis.m_el[2].m_floats + 2);
  uVar10 = *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_origin.m_floats;
  uVar11 = *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_origin.m_floats + 2);
  pbVar3 = pbVar2[childShapeIndex].m_node;
  pbVar12 = pbVar2[childShapeIndex].m_childShape;
  uVar13 = (&pbVar2[childShapeIndex].m_childShape)[1];
  uVar14 = *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_basis.m_el[0].m_floats + 2);
  *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_basis.m_el[0].m_floats =
       *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_basis.m_el[0].m_floats;
  *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_basis.m_el[0].m_floats + 2) = uVar14;
  uVar14 = *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_basis.m_el[1].m_floats + 2);
  *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_basis.m_el[1].m_floats =
       *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_basis.m_el[1].m_floats;
  *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_basis.m_el[1].m_floats + 2) = uVar14;
  uVar14 = *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_basis.m_el[2].m_floats + 2);
  *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_basis.m_el[2].m_floats =
       *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_basis.m_el[2].m_floats;
  *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_basis.m_el[2].m_floats + 2) = uVar14;
  uVar14 = *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_origin.m_floats + 2);
  *(undefined8 *)pbVar2[childShapeIndex].m_transform.m_origin.m_floats =
       *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_origin.m_floats;
  *(undefined8 *)(pbVar2[childShapeIndex].m_transform.m_origin.m_floats + 2) = uVar14;
  pbVar2[childShapeIndex].m_node = pbVar2[lVar15 + -1].m_node;
  uVar14 = (&pbVar2[lVar15 + -1].m_childShape)[1];
  pbVar2[childShapeIndex].m_childShape = pbVar2[lVar15 + -1].m_childShape;
  (&pbVar2[childShapeIndex].m_childShape)[1] = (btCollisionShape *)uVar14;
  pbVar2 = (this->m_children).m_data;
  *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_basis.m_el[0].m_floats = uVar4;
  *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_basis.m_el[0].m_floats + 2) = uVar5;
  *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_basis.m_el[1].m_floats = uVar6;
  *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_basis.m_el[1].m_floats + 2) = uVar7;
  *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_basis.m_el[2].m_floats = uVar8;
  *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_basis.m_el[2].m_floats + 2) = uVar9;
  *(undefined8 *)pbVar2[lVar15 + -1].m_transform.m_origin.m_floats = uVar10;
  *(undefined8 *)(pbVar2[lVar15 + -1].m_transform.m_origin.m_floats + 2) = uVar11;
  pbVar2[lVar15 + -1].m_childShape = pbVar12;
  (&pbVar2[lVar15 + -1].m_childShape)[1] = (btCollisionShape *)uVar13;
  pbVar2[lVar15 + -1].m_node = pbVar3;
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    (((this->m_children).m_data[childShapeIndex].m_node)->field_2).dataAsInt = childShapeIndex;
  }
  piVar1 = &(this->m_children).m_size;
  *piVar1 = *piVar1 + -1;
  return;
}

Assistant:

void btCompoundShape::removeChildShapeByIndex(int childShapeIndex)
{
	m_updateRevision++;
	btAssert(childShapeIndex >=0 && childShapeIndex < m_children.size());
	if (m_dynamicAabbTree)
	{
		m_dynamicAabbTree->remove(m_children[childShapeIndex].m_node);
	}
	m_children.swap(childShapeIndex,m_children.size()-1);
    if (m_dynamicAabbTree) 
		m_children[childShapeIndex].m_node->dataAsInt = childShapeIndex;
	m_children.pop_back();

}